

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<double>_>::Print
          (TPZMatrix<std::complex<double>_> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  complex<double> a;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  int in_ECX;
  ostream *in_RDX;
  char *in_RSI;
  TPZBaseMatrix *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  double dVar5;
  undefined4 in_XMM1_Da;
  undefined4 uVar6;
  undefined4 in_XMM1_Db;
  undefined4 uVar7;
  complex<double> val_4;
  int64_t col_7;
  int64_t colmax_1;
  int64_t row_7;
  complex<double> val_3;
  int64_t col_6;
  int64_t colmax;
  int64_t row_6;
  int64_t nrow;
  int64_t numzero;
  bool sym;
  int64_t col_5;
  int64_t row_5;
  char signchar;
  complex<double> val_2;
  int64_t col_4;
  int64_t row_4;
  complex<double> val_1;
  int64_t col_3;
  int64_t row_3;
  complex<double> val;
  int64_t col_2;
  int64_t row_2;
  int64_t col_1;
  int64_t row_1;
  anon_class_4_1_2f8713ba PrintVal;
  int columnlength;
  complex<double> value;
  int64_t col;
  int64_t row;
  int64_t ncols;
  int64_t nrows;
  ios cout_state;
  ostream *in_stack_fffffffffffffaf8;
  ostream *in_stack_fffffffffffffb00;
  ostream *in_stack_fffffffffffffb08;
  anon_class_4_1_2f8713ba *in_stack_fffffffffffffb10;
  complex<double> local_2c0;
  complex local_2b0 [8];
  undefined8 local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  complex<double> local_288;
  undefined8 local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  byte local_239;
  long local_228;
  long local_220;
  char local_211;
  complex<double> local_210;
  long local_200;
  long local_1f8;
  complex<double> local_1f0;
  long local_1e0;
  long local_1d8;
  complex<double> local_1d0;
  complex local_1c0 [8];
  undefined8 local_1b8;
  long local_1b0;
  long local_1a8;
  undefined8 uStack_198;
  long local_190;
  long local_188;
  undefined4 local_180;
  undefined4 local_17c;
  complex<double> local_178;
  complex local_168 [8];
  undefined8 local_160;
  long local_158;
  long local_150;
  int64_t local_148;
  long local_140;
  int local_138;
  ios local_128 [268];
  int local_1c;
  ostream *local_18;
  char *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ios::ios(local_128,(streambuf *)0x0);
  std::ios::copyfmt(local_128);
  poVar3 = local_18;
  local_138 = (int)std::setprecision(0x11);
  std::operator<<(poVar3,(_Setprecision)local_138);
  local_140 = TPZBaseMatrix::Rows(in_RDI);
  local_148 = TPZBaseMatrix::Cols(in_RDI);
  if (local_1c == 0) {
    std::operator<<(local_18,"Writing matrix \'");
    if (local_10 != (char *)0x0) {
      std::operator<<(local_18,local_10);
    }
    poVar3 = std::operator<<(local_18,"\' (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_140);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    std::operator<<(poVar3,"):\n");
    for (local_150 = 0; local_150 < local_140; local_150 = local_150 + 1) {
      std::operator<<(local_18,"\t");
      for (local_158 = 0; poVar3 = local_18, local_158 < local_148; local_158 = local_158 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_150,local_158);
        local_160 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
        in_XMM1_Da = (undefined4)extraout_XMM0_Qa;
        in_XMM1_Db = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
        poVar3 = std::operator<<(poVar3,local_168);
        std::operator<<(poVar3,"  ");
      }
      std::operator<<(local_18,"\n");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 6) {
    std::operator<<(local_18,"Writing matrix \'");
    if (local_10 != (char *)0x0) {
      std::operator<<(local_18,local_10);
    }
    poVar3 = std::operator<<(local_18,"\' (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_140);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    std::operator<<(poVar3,"):\n");
    uVar6 = 0;
    uVar7 = 0;
    std::complex<double>::complex(&local_178,0.0,0.0);
    local_17c = 0x11;
    local_180 = 0x11;
    for (local_188 = 0; local_188 < local_140; local_188 = local_188 + 1) {
      for (local_190 = 0; local_190 < local_148; local_190 = local_190 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_188,local_190);
        uStack_198._4_4_ = uVar7;
        uStack_198._0_4_ = uVar6;
        uVar6 = (undefined4)extraout_XMM0_Qa_00;
        uVar7 = (undefined4)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        local_178._M_value._8_8_ = uStack_198;
        std::operator<<(local_18,"(");
        std::complex<double>::real_abi_cxx11_(&local_178);
        Print::anon_class_4_1_2f8713ba::operator()
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                   (type_conflict1)in_stack_fffffffffffffb00);
        std::operator<<(local_18,",");
        std::complex<double>::imag_abi_cxx11_(&local_178);
        Print::anon_class_4_1_2f8713ba::operator()
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                   (type_conflict1)in_stack_fffffffffffffb00);
        std::operator<<(local_18,")");
      }
      std::operator<<(local_18,"\n");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_18,local_140);
    poVar3 = std::operator<<(poVar3," ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_148);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    for (local_1a8 = 0; local_1a8 < local_140; local_1a8 = local_1a8 + 1) {
      for (local_1b0 = 0; local_1b0 < local_148; local_1b0 = local_1b0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_1a8,local_1b0);
        local_1b8 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
        in_XMM1_Da = 0;
        in_XMM1_Db = 0;
        std::complex<double>::complex(&local_1d0,0.0,0.0);
        bVar1 = std::operator!=((complex<double> *)in_stack_fffffffffffffb00,
                                (complex<double> *)in_stack_fffffffffffffaf8);
        if (bVar1) {
          poVar3 = (ostream *)std::ostream::operator<<(local_18,local_1a8);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0);
          poVar3 = std::operator<<(poVar3,' ');
          poVar3 = std::operator<<(poVar3,local_1c0);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::operator<<(local_18,"-1 -1 0.\n");
  }
  else if (local_1c == 2) {
    poVar3 = std::operator<<(local_18,local_10);
    std::operator<<(poVar3,"\n{ ");
    for (local_1d8 = 0; local_1d8 < local_140; local_1d8 = local_1d8 + 1) {
      std::operator<<(local_18,"\n{ ");
      for (local_1e0 = 0; local_1e0 < local_148; local_1e0 = local_1e0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_1d8,local_1e0);
        poVar3 = local_18;
        local_1f0._M_value._12_4_ = in_XMM1_Db;
        local_1f0._M_value._8_4_ = in_XMM1_Da;
        in_XMM1_Da = (undefined4)extraout_XMM0_Qa_01;
        in_XMM1_Db = (undefined4)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        dVar5 = std::complex<double>::real_abi_cxx11_(&local_1f0);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
        poVar3 = std::operator<<(poVar3,"+I");
        dVar5 = std::complex<double>::imag_abi_cxx11_(&local_1f0);
        std::ostream::operator<<(poVar3,dVar5);
        if (local_1e0 < local_148 + -1) {
          std::operator<<(local_18,", ");
        }
        if ((local_1e0 + 1) % 6 == 0) {
          std::operator<<(local_18,'\n');
        }
      }
      std::operator<<(local_18," }");
      if (local_1d8 < local_140 + -1) {
        std::operator<<(local_18,",");
      }
    }
    poVar3 = std::operator<<(local_18," };");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (local_1c == 5) {
    for (local_1f8 = 0; local_1f8 < local_140; local_1f8 = local_1f8 + 1) {
      for (local_200 = 0; local_200 < local_148; local_200 = local_200 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_1f8,local_200);
        local_210._M_value._12_4_ = in_XMM1_Db;
        local_210._M_value._8_4_ = in_XMM1_Da;
        dVar5 = std::complex<double>::imag_abi_cxx11_(&local_210);
        poVar3 = local_18;
        local_211 = (dVar5 <= 0.0) * '\x02' + '+';
        dVar5 = std::complex<double>::real_abi_cxx11_(&local_210);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
        poVar3 = std::operator<<(poVar3,local_211);
        dVar5 = std::complex<double>::imag_abi_cxx11_(&local_210);
        in_XMM1_Da = (undefined4)DAT_0203e3c0;
        in_XMM1_Db = DAT_0203e3c0._4_4_;
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(double)((ulong)dVar5 & (ulong)DAT_0203e3c0));
        std::operator<<(poVar3,"j");
        if (local_200 < local_148 + -1) {
          std::operator<<(local_18," , ");
        }
      }
      if (local_1f8 < local_140 + -1) {
        std::operator<<(local_18,"\n");
      }
    }
  }
  else if (local_1c == 3) {
    std::operator<<(local_18,local_10);
    for (local_220 = 0; local_220 < local_140; local_220 = local_220 + 1) {
      std::operator<<(local_18,"\n|");
      for (local_228 = 0; local_228 < local_148; local_228 = local_228 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_220,local_228);
        a._M_value._8_8_ = in_stack_fffffffffffffb00;
        a._M_value._0_8_ = in_stack_fffffffffffffaf8;
        bVar1 = IsZero(a);
        if (bVar1) {
          std::operator<<(local_18,".");
        }
        else {
          std::operator<<(local_18,"#");
        }
      }
      std::operator<<(local_18,"|");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 4) {
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x10])();
    local_239 = iVar2 != 0;
    local_248 = 0;
    local_250 = local_140;
    for (local_258 = 0; local_258 < local_140; local_258 = local_258 + 1) {
      local_260 = local_250;
      if ((local_239 & 1) != 0) {
        local_260 = local_258 + 1;
      }
      for (local_268 = 0; local_268 < local_260; local_268 = local_268 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_258,local_268);
        local_270 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
        in_XMM1_Da = 0;
        in_XMM1_Db = 0;
        std::complex<double>::complex(&local_288,0.0,0.0);
        bVar1 = std::operator!=((complex<double> *)in_stack_fffffffffffffb00,
                                (complex<double> *)in_stack_fffffffffffffaf8);
        if (bVar1) {
          local_248 = local_248 + 1;
        }
      }
    }
    poVar3 = std::operator<<(local_18,"%%");
    poVar3 = std::operator<<(poVar3,local_10);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(local_18,local_140);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_148);
    poVar3 = std::operator<<(poVar3,' ');
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_248);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    for (local_290 = 0; local_290 < local_140; local_290 = local_290 + 1) {
      local_298 = local_250;
      if ((local_239 & 1) != 0) {
        local_298 = local_290 + 1;
      }
      for (local_2a0 = 0; local_2a0 < local_298; local_2a0 = local_2a0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_290,local_2a0);
        local_2a8 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
        in_XMM1_Da = 0;
        in_XMM1_Db = 0;
        std::complex<double>::complex(&local_2c0,0.0,0.0);
        bVar1 = std::operator!=((complex<double> *)in_stack_fffffffffffffb00,
                                (complex<double> *)in_stack_fffffffffffffaf8);
        if (bVar1) {
          poVar3 = (ostream *)std::ostream::operator<<(local_18,local_290 + 1);
          poVar3 = std::operator<<(poVar3,' ');
          in_stack_fffffffffffffb00 = (ostream *)std::ostream::operator<<(poVar3,local_2a0 + 1);
          in_stack_fffffffffffffaf8 = std::operator<<(in_stack_fffffffffffffb00,' ');
          poVar3 = std::operator<<(in_stack_fffffffffffffaf8,local_2b0);
          std::operator<<(poVar3,'\n');
        }
      }
    }
  }
  std::ios::copyfmt((ios *)(local_18 + *(long *)(*(long *)local_18 + -0x18)));
  std::ios::~ios(local_128);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}